

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::LineDataDrawer::DrawData
          (LineDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  pointer piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_var;
  long inEndIndex;
  bool bVar9;
  uint uVar10;
  Trafo *pTVar11;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  long theEnd;
  long theStart;
  float local_88;
  float local_84;
  float local_80;
  long local_50;
  long local_48;
  PlotDataSelection *local_40;
  long local_38;
  
  if (((((this->super_DataDrawerBase).mXTrafo != (Trafo *)0x0) &&
       ((this->super_DataDrawerBase).mYTrafo != (Trafo *)0x0)) &&
      (lVar7 = PlotDataBase::GetSize(inXData), lVar7 != 0)) &&
     (lVar7 = PlotDataBase::GetSize(inYData), lVar7 != 0)) {
    lVar7 = PlotDataBase::GetSize(inXData);
    lVar8 = PlotDataBase::GetSize(inYData);
    if (lVar7 <= lVar8) {
      (*inPainter->_vptr_Painter[0xc])(inPainter,&this->mStyle);
      local_48 = 0;
      local_50 = PlotDataBase::GetSize(inXData);
      local_50 = local_50 + -1;
      uVar10 = 1;
      if ((this->super_DataDrawerBase).mDrawFast == true) {
        FindRange(inXData,inXAxisSetup->mMin,inXAxisSetup->mMax,&local_48,&local_50);
        lVar7 = local_50 - local_48;
        iVar4 = (*inPainter->_vptr_Painter[4])();
        uVar5 = (uint)((lVar7 + 1) / CONCAT44(extraout_var,iVar4));
        uVar10 = 1;
        if (1 < uVar5) {
          uVar10 = uVar5;
        }
      }
      lVar7 = local_50;
      lVar8 = (long)(int)local_48;
      bVar9 = local_50 < lVar8;
      if (local_50 < lVar8) {
        return bVar9;
      }
      local_38 = (long)(int)uVar10;
      iVar4 = uVar10 + (int)local_48 + -1;
      local_80 = 0.0;
      bVar3 = true;
      local_84 = 0.0;
      local_40 = inPlotDataSelection;
      while( true ) {
        pTVar11 = (this->super_DataDrawerBase).mXTrafo;
        PlotDataBase::GetValue(inXData,lVar8);
        (*pTVar11->_vptr_Trafo[2])(pTVar11);
        if ((int)uVar10 < 2) {
          pTVar11 = (this->super_DataDrawerBase).mYTrafo;
          PlotDataBase::GetValue(inYData,lVar8);
        }
        else {
          inEndIndex = (long)iVar4;
          if (lVar7 < iVar4) {
            inEndIndex = lVar7;
          }
          pTVar11 = (this->super_DataDrawerBase).mYTrafo;
          GetMaxFromRange(inYData,lVar8,inEndIndex);
        }
        (*pTVar11->_vptr_Trafo[2])(pTVar11);
        if ((bVar3) || ((this->super_DataDrawerBase).field_0x24 != '\x01')) {
          bVar3 = false;
        }
        else {
          (**inPainter->_vptr_Painter)(local_84,local_80,extraout_XMM0_Da,extraout_XMM0_Da_00);
        }
        if ((((this->super_DataDrawerBase).field_0x25 == '\x01') &&
            (iVar6 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                               (this,(ulong)(uint)(int)extraout_XMM0_Da,
                                (ulong)(uint)(int)extraout_XMM0_Da_00,inRect,inPainter),
            (char)iVar6 == '\0')) ||
           ((piVar1 = (local_40->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,
            lVar8 < (long)(local_40->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1 >> 2 &&
            ((0 < piVar1[lVar8] &&
             (iVar6 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[5])
                                (this,(ulong)(uint)(int)extraout_XMM0_Da,
                                 (ulong)(uint)(int)extraout_XMM0_Da_00,inRect,inPainter),
             (char)iVar6 == '\0')))))) {
          bVar2 = false;
          local_88 = local_84;
        }
        else {
          bVar2 = true;
          local_80 = extraout_XMM0_Da_00;
          local_88 = extraout_XMM0_Da;
        }
        if (!bVar2) break;
        lVar8 = lVar8 + local_38;
        iVar4 = iVar4 + uVar10;
        local_84 = local_88;
        bVar9 = lVar7 < lVar8;
        if (lVar7 < lVar8) {
          return bVar9;
        }
      }
      return bVar9;
    }
  }
  return false;
}

Assistant:

bool LineDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if ((inXData.GetSize () == 0) || (inYData.GetSize () == 0)) {
          return false;
      }
      long theXSize = inXData.GetSize ();
      long theYSize = inYData.GetSize ();
      if (theXSize>theYSize) {
        return false;
      }
      inPainter.SetStyle (mStyle);
      float thePrevX = 0;
      float thePrevY = 0;
      bool theFirst = true;
      float theTraX, theTraY;

      long theStart = 0;
      long theEnd = inXData.GetSize () - 1;
      int theStride = 1;
      if (mDrawFast) {
          FindRange (inXData, inXAxisSetup.mMin, inXAxisSetup.mMax, theStart, theEnd);

          theStride = (theEnd - theStart + 1) / inPainter.GetWidth ();
          if (theStride == 0) {
              theStride = 1;
          }
      }


      for (int theI = theStart; theI <= theEnd; theI+=theStride) {

        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        if (theStride > 1) {
          long theLast = theI + theStride - 1;
          if (theLast>theEnd) {
            theLast = theEnd;
          }
            theTraY = mYTrafo->Transform (GetMaxFromRange (inYData, theI, theLast));
        }
        else {
            theTraY = mYTrafo->Transform (inYData.GetValue (theI));
        }

        if (!theFirst && mDrawLine) {
          inPainter.DrawLine (thePrevX, thePrevY, theTraX, theTraY);
        }
        else {
          theFirst = false;
        }
        bool theDrawPoint = mDrawPoint;

        if (theDrawPoint && !DrawPoint (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        if (inPlotDataSelection.IsSelected (theI) && !DrawSelection (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        thePrevX = theTraX;
        thePrevY = theTraY;
      }
      return true;
    }